

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeThumbTableBranch(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  
  uVar1 = Insn >> 0x10 & 0xf;
  Decoder_00 = GPRDecoderTable;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
  DVar2 = DecoderGPRRegisterClass(Inst,Insn & 0xf,Address_00,Decoder_00);
  if (DVar2 != MCDisassembler_Fail) {
    if (DVar2 == MCDisassembler_Success) {
      DVar2 = (uint)(uVar1 != 0xc) * 2 + MCDisassembler_SoftFail;
    }
    else if (DVar2 != MCDisassembler_SoftFail) {
      DVar2 = MCDisassembler_Fail;
    }
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeThumbTableBranch(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);

	if (Rn == ARM_SP) S = MCDisassembler_SoftFail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}